

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<unsigned_int,int>::
Update<duckdb::BitpackingCompressionState<unsigned_int,true,int>::BitpackingWriter>
          (BitpackingState<unsigned_int,int> *this,uint value,bool is_valid)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  
  lVar1 = *(long *)(this + 0x4810);
  this[lVar1 + 0x4010] = (BitpackingState<unsigned_int,int>)is_valid;
  this[0x4844] = (BitpackingState<unsigned_int,int>)((byte)this[0x4844] & is_valid);
  this[0x4845] = (BitpackingState<unsigned_int,int>)((byte)this[0x4845] & !is_valid);
  if (is_valid) {
    *(uint *)(*(long *)(this + 0x2008) + lVar1 * 4) = value;
    uVar3 = *(uint *)(this + 0x4828);
    if (value <= *(uint *)(this + 0x4828)) {
      uVar3 = value;
    }
    *(uint *)(this + 0x4828) = uVar3;
    if (value < *(uint *)(this + 0x482c)) {
      value = *(uint *)(this + 0x482c);
    }
    *(uint *)(this + 0x482c) = value;
  }
  *(long *)(this + 0x4810) = lVar1 + 1;
  if (lVar1 + 1 == 0x800) {
    bVar2 = Flush<duckdb::BitpackingCompressionState<unsigned_int,true,int>::BitpackingWriter>(this)
    ;
    BitpackingState<unsigned_int,_int>::Reset((BitpackingState<unsigned_int,_int> *)this);
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}